

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void compute_nullable(Grammar *g)

{
  Elem *pEVar1;
  bool bVar2;
  Elem *e;
  uint changed;
  uint k;
  uint j;
  uint i;
  Grammar *g_local;
  
  bVar2 = true;
  k = 0;
  do {
    if ((g->productions).n <= k) {
      do {
        if (!bVar2) {
          return;
        }
        bVar2 = false;
        for (k = 0; k < (g->productions).n; k = k + 1) {
          if (((g->productions).v[k]->nullable == (Rule *)0x0) &&
             (((g->productions).v[k]->rules).n != 0)) {
            for (e._4_4_ = 0; e._4_4_ < ((*((g->productions).v[k]->rules).v)->elems).n;
                e._4_4_ = e._4_4_ + 1) {
              pEVar1 = ((*((g->productions).v[k]->rules).v)->elems).v[e._4_4_];
              if ((pEVar1->kind != ELEM_NTERM) || (((pEVar1->e).nterm)->nullable == (Rule *)0x0))
              goto LAB_00143b17;
            }
            bVar2 = true;
            (g->productions).v[k]->nullable = *((g->productions).v[k]->rules).v;
          }
LAB_00143b17:
        }
      } while( true );
    }
    for (changed = 0; changed < ((g->productions).v[k]->rules).n; changed = changed + 1) {
      if ((((g->productions).v[k]->rules).v[changed]->elems).n == 0) {
        (g->productions).v[k]->nullable = ((g->productions).v[k]->rules).v[changed];
        break;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void compute_nullable(Grammar *g) {
  uint i, j, k, changed = 1;
  Elem *e;

  /* ensure that the trivial case is the first cause */
  for (i = 0; i < g->productions.n; i++) {
    for (j = 0; j < g->productions.v[i]->rules.n; j++)
      if (!g->productions.v[i]->rules.v[j]->elems.n) {
        g->productions.v[i]->nullable = g->productions.v[i]->rules.v[j];
        break;
      }
  }
  /* transitive closure */
  while (changed) {
    changed = 0;
    for (i = 0; i < g->productions.n; i++) {
      if (!g->productions.v[i]->nullable)
        for (j = 0; j < g->productions.v[i]->rules.n; j++) {
          for (k = 0; k < g->productions.v[i]->rules.v[j]->elems.n; k++) {
            e = g->productions.v[i]->rules.v[j]->elems.v[k];
            if (e->kind != ELEM_NTERM || !e->e.nterm->nullable) goto Lnot_nullable;
          }
          changed = 1;
          g->productions.v[i]->nullable = g->productions.v[i]->rules.v[j];
          break;
        }
    Lnot_nullable:;
    }
  }
}